

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

programInfo * __thiscall
gl4cts::GPUShaderFP64Test3::getProgramInfo
          (GPUShaderFP64Test3 *this,uniformDataLayout uniform_data_layout)

{
  programInfo *local_20;
  programInfo *program_info;
  uniformDataLayout uniform_data_layout_local;
  GPUShaderFP64Test3 *this_local;
  
  local_20 = (programInfo *)0x0;
  if (uniform_data_layout == PACKED) {
    local_20 = &this->m_packed_program;
  }
  else if (uniform_data_layout == SHARED) {
    local_20 = &this->m_shared_program;
  }
  else if (uniform_data_layout == STD140) {
    local_20 = &this->m_std140_program;
  }
  return local_20;
}

Assistant:

const GPUShaderFP64Test3::programInfo& GPUShaderFP64Test3::getProgramInfo(uniformDataLayout uniform_data_layout) const
{
	const programInfo* program_info = 0;

	switch (uniform_data_layout)
	{
	case PACKED:

		program_info = &m_packed_program;

		break;

	case SHARED:

		program_info = &m_shared_program;

		break;

	case STD140:

		program_info = &m_std140_program;

		break;
	}

	return *program_info;
}